

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

int4 __thiscall EmitXml::beginBlock(EmitXml *this,FlowBlock *bl)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->s,"<block ");
  poVar1 = std::operator<<(poVar1,highlight[8]);
  poVar1 = std::operator<<(poVar1," blockref=\"0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bl->index);
  std::operator<<(poVar1,"\">");
  return 0;
}

Assistant:

int4 EmitXml::beginBlock(const FlowBlock *bl) {
  *s << "<block " << highlight[(int4)no_color] << " blockref=\"0x" << hex <<
    bl->getIndex() << "\">";
  return 0;
}